

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_solve_sparse.c
# Opt level: O3

lu_int basiclu_solve_sparse
                 (lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                 lu_int *Wi,double *Wx,lu_int nzrhs,lu_int *irhs,double *xrhs,lu_int *p_nzlhs,
                 lu_int *ilhs,double *lhs,char trans)

{
  bool bVar1;
  lu_int lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  lu this;
  
  lVar2 = lu_load(&this,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar2 == 0) {
    auVar8._0_4_ = -(uint)((int)irhs == 0);
    auVar8._4_4_ = -(uint)((int)((ulong)irhs >> 0x20) == 0);
    auVar8._8_4_ = -(uint)((int)xrhs == 0);
    auVar8._12_4_ = -(uint)((int)((ulong)xrhs >> 0x20) == 0);
    auVar11._4_4_ = auVar8._0_4_;
    auVar11._0_4_ = auVar8._4_4_;
    auVar11._8_4_ = auVar8._12_4_;
    auVar11._12_4_ = auVar8._8_4_;
    auVar10._0_4_ = -(uint)((int)Wi == 0);
    auVar10._4_4_ = -(uint)((int)((ulong)Wi >> 0x20) == 0);
    auVar10._8_4_ = -(uint)((int)Wx == 0);
    auVar10._12_4_ = -(uint)((int)((ulong)Wx >> 0x20) == 0);
    auVar9._4_4_ = auVar10._0_4_;
    auVar9._0_4_ = auVar10._4_4_;
    auVar9._8_4_ = auVar10._12_4_;
    auVar9._12_4_ = auVar10._8_4_;
    auVar10 = packssdw(auVar9 & auVar10,auVar11 & auVar8);
    auVar6._0_4_ = -(uint)((int)Ui == 0);
    auVar6._4_4_ = -(uint)((int)((ulong)Ui >> 0x20) == 0);
    auVar6._8_4_ = -(uint)((int)Ux == 0);
    auVar6._12_4_ = -(uint)((int)((ulong)Ux >> 0x20) == 0);
    auVar7._4_4_ = auVar6._0_4_;
    auVar7._0_4_ = auVar6._4_4_;
    auVar7._8_4_ = auVar6._12_4_;
    auVar7._12_4_ = auVar6._8_4_;
    auVar5._0_4_ = -(uint)((int)Li == 0);
    auVar5._4_4_ = -(uint)((int)((ulong)Li >> 0x20) == 0);
    auVar5._8_4_ = -(uint)((int)Lx == 0);
    auVar5._12_4_ = -(uint)((int)((ulong)Lx >> 0x20) == 0);
    auVar4._4_4_ = auVar5._0_4_;
    auVar4._0_4_ = auVar5._4_4_;
    auVar4._8_4_ = auVar5._12_4_;
    auVar4._12_4_ = auVar5._8_4_;
    auVar5 = packssdw(auVar4 & auVar5,auVar7 & auVar6);
    auVar5 = packssdw(auVar5,auVar10);
    lVar2 = -3;
    if (((((((((((auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar5 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar5 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf])
         && (p_nzlhs != (lu_int *)0x0)) && (ilhs != (lu_int *)0x0)) && (lhs != (double *)0x0)) {
      if (this.nupdate < 0) {
        lVar2 = -2;
      }
      else {
        if (nzrhs < 1 || nzrhs > this.m) {
          bVar1 = -1 < nzrhs && nzrhs <= this.m;
        }
        else {
          uVar3 = 1;
          do {
            bVar1 = irhs[uVar3 - 1] < this.m && -1 < irhs[uVar3 - 1];
            if ((uint)nzrhs <= uVar3) break;
            uVar3 = uVar3 + 1;
          } while (bVar1);
        }
        lVar2 = -4;
        if (bVar1) {
          lu_solve_sparse(&this,nzrhs,irhs,xrhs,p_nzlhs,ilhs,lhs,trans);
          lVar2 = 0;
        }
      }
    }
    lVar2 = lu_save(&this,istore,xstore,lVar2);
  }
  return lVar2;
}

Assistant:

lu_int basiclu_solve_sparse
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    lu_int nzrhs,
    const lu_int irhs[],
    const double xrhs[],
    lu_int *p_nzlhs,
    lu_int ilhs[],
    double lhs[],
    char trans
)
{
    struct lu this;
    lu_int status, n, ok;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && irhs && xrhs && p_nzlhs && ilhs
           && lhs))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else
    {
        /* check RHS indices */
        ok = nzrhs >= 0 && nzrhs <= this.m;
        for (n = 0; n < nzrhs && ok; n++)
        {
            ok = ok && irhs[n] >= 0 && irhs[n] < this.m;
        }
        if (!ok)
            status = BASICLU_ERROR_invalid_argument;
    }

    if (status == BASICLU_OK)
    {
        lu_solve_sparse(&this, nzrhs, irhs, xrhs, p_nzlhs, ilhs, lhs, trans);
    }

    return lu_save(&this, istore, xstore, status);
}